

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O0

void __thiscall QHttpNetworkRequest::setPipeliningAllowed(QHttpNetworkRequest *this,bool b)

{
  byte bVar1;
  QHttpNetworkRequestPrivate *pQVar2;
  byte in_SIL;
  undefined6 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  pQVar2 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->
                     ((QSharedDataPointer<QHttpNetworkRequestPrivate> *)
                      (CONCAT17(in_SIL,CONCAT16(in_SIL,in_stack_fffffffffffffff0)) &
                      0x101ffffffffffff));
  pQVar2->pipeliningAllowed = (bool)(bVar1 & 1);
  return;
}

Assistant:

void QHttpNetworkRequest::setPipeliningAllowed(bool b)
{
    d->pipeliningAllowed = b;
}